

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBlitImage::BlitImplementation::BlitImplementation
          (BlitImplementation *this,OperationContext *context,Resource *resource,AccessMode mode)

{
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  ImageResource *pIVar1;
  NotSupportedError *this_00;
  VkFormatProperties VVar2;
  VkFormatFeatureFlags requiredFlags;
  uint uStack_50;
  VkFormatProperties formatProps;
  VkPhysicalDevice physDevice;
  InstanceInterface *vki;
  AccessMode mode_local;
  Resource *resource_local;
  OperationContext *context_local;
  BlitImplementation *this_local;
  
  ImplementationBase::ImplementationBase(&this->super_ImplementationBase,context,resource,mode);
  (this->super_ImplementationBase).super_Operation._vptr_Operation =
       (_func_int **)&PTR__BlitImplementation_016b33f8;
  makeBlitRegion(&this->m_blitRegion,(this->super_ImplementationBase).m_resource);
  vk = OperationContext::getInstanceInterface((this->super_ImplementationBase).m_context);
  physicalDevice = OperationContext::getPhysicalDevice((this->super_ImplementationBase).m_context);
  pIVar1 = Resource::getImage((this->super_ImplementationBase).m_resource);
  VVar2 = ::vk::getPhysicalDeviceFormatProperties(vk,physicalDevice,pIVar1->format);
  uStack_50 = VVar2.optimalTilingFeatures;
  if ((uStack_50 & 0xc00) != 0xc00) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Format doesn\'t support blits",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperation.cpp"
               ,0x33f);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

BlitImplementation (OperationContext& context, Resource& resource, const AccessMode mode)
		: ImplementationBase	(context, resource, mode)
		, m_blitRegion			(makeBlitRegion(m_resource))
	{
		const InstanceInterface&	vki				= m_context.getInstanceInterface();
		const VkPhysicalDevice		physDevice		= m_context.getPhysicalDevice();
		const VkFormatProperties	formatProps		= getPhysicalDeviceFormatProperties(vki, physDevice, m_resource.getImage().format);
		const VkFormatFeatureFlags	requiredFlags	= (VK_FORMAT_FEATURE_BLIT_SRC_BIT | VK_FORMAT_FEATURE_BLIT_DST_BIT);

		// SRC and DST blit is required because both images are using the same format.
		if ((formatProps.optimalTilingFeatures & requiredFlags) != requiredFlags)
			TCU_THROW(NotSupportedError, "Format doesn't support blits");
	}